

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# powi.c
# Opt level: O1

float powif(float base,int exp)

{
  uint uVar1;
  ulong uVar2;
  int n;
  float x;
  float fVar3;
  
  if (exp != 0) {
    if (exp < 0) {
      base = 1.0 / base;
    }
    uVar2 = (ulong)(uint)-exp;
    if (0 < exp) {
      uVar2 = (ulong)(uint)exp;
    }
    fVar3 = 1.0;
    if ((uVar2 & 1) != 0) {
      fVar3 = base;
    }
    if (1 < (uint)uVar2) {
      do {
        base = base * base;
        if ((uVar2 & 2) != 0) {
          fVar3 = fVar3 * base;
        }
        uVar1 = (uint)uVar2;
        uVar2 = uVar2 >> 1;
      } while (3 < uVar1);
    }
    return fVar3;
  }
  return 1.0;
}

Assistant:

float powif(float base, int exp)
{
    float x = base;
    int n = exp;
    float pow = 1.0;

    if (n != 0)  {
        if (n < 0) {
            n = -n;
            x = 1 / x;
        }
        for ( ; ; ) {
            if (n & 01)
                pow *= x;
            if (n >>= 1)
                x *= x;
            else
                break;
        }
    }
    return pow;
}